

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  char cVar1;
  long lVar2;
  long *plVar3;
  Message *pMVar4;
  ostream *poVar5;
  bool bVar6;
  char *pcVar7;
  scoped_ptr<google::protobuf::Message> message;
  ErrorPrinter error_collector;
  Parser parser;
  DynamicMessageFactory dynamic_factory;
  FileOutputStream out;
  FileInputStream in;
  
  lVar2 = google::protobuf::DescriptorPool::FindMessageTypeByName((string *)pool);
  if (lVar2 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Type not defined: ");
    poVar5 = std::operator<<(poVar5,(string *)&this->codec_type_);
    std::endl<char,std::char_traits<char>>(poVar5);
    return false;
  }
  google::protobuf::DynamicMessageFactory::DynamicMessageFactory(&dynamic_factory,pool);
  plVar3 = (long *)google::protobuf::DynamicMessageFactory::GetPrototype
                             ((Descriptor *)&dynamic_factory);
  message.ptr_ = (Message *)(**(code **)(*plVar3 + 0x18))(plVar3);
  google::protobuf::io::FileInputStream::FileInputStream(&in,0,-1);
  google::protobuf::io::FileOutputStream::FileOutputStream(&out,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    error_collector.format_ = this->error_format_;
    error_collector._0_8_ = &PTR__ErrorPrinter_0019a980;
    error_collector._8_8_ = &PTR__ErrorPrinter_0019a9b0;
    error_collector.tree_ = (DiskSourceTree *)0x0;
    google::protobuf::TextFormat::Parser::Parser(&parser);
    _parser = &error_collector.super_ErrorCollector;
    cVar1 = google::protobuf::TextFormat::Parser::Parse
                      ((ZeroCopyInputStream *)&parser,(Message *)&in);
    if (cVar1 != '\0') {
      google::protobuf::TextFormat::Parser::~Parser(&parser);
      ErrorPrinter::~ErrorPrinter(&error_collector);
LAB_00140625:
      pMVar4 = internal::scoped_ptr<google::protobuf::Message>::operator->(&message);
      cVar1 = (**(code **)(*(long *)pMVar4 + 0x28))(pMVar4);
      if (cVar1 == '\0') {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "warning:  Input message is missing required fields:  ");
        pMVar4 = internal::scoped_ptr<google::protobuf::Message>::operator->(&message);
        (**(code **)(*(long *)pMVar4 + 0x30))(&error_collector,pMVar4);
        poVar5 = std::operator<<(poVar5,(string *)&error_collector);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&error_collector);
      }
      if (this->mode_ == MODE_ENCODE) {
        pMVar4 = internal::scoped_ptr<google::protobuf::Message>::operator->(&message);
        cVar1 = google::protobuf::MessageLite::SerializePartialToZeroCopyStream
                          ((ZeroCopyOutputStream *)pMVar4);
      }
      else {
        pMVar4 = internal::scoped_ptr<google::protobuf::Message>::operator*(&message);
        cVar1 = google::protobuf::TextFormat::Print(pMVar4,(ZeroCopyOutputStream *)&out);
      }
      bVar6 = true;
      if (cVar1 != '\0') goto LAB_00140717;
      pcVar7 = "output: I/O error.";
      goto LAB_00140701;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
    std::endl<char,std::char_traits<char>>(poVar5);
    google::protobuf::TextFormat::Parser::~Parser(&parser);
    ErrorPrinter::~ErrorPrinter(&error_collector);
  }
  else {
    pMVar4 = internal::scoped_ptr<google::protobuf::Message>::operator->(&message);
    cVar1 = google::protobuf::MessageLite::ParsePartialFromZeroCopyStream
                      ((ZeroCopyInputStream *)pMVar4);
    if (cVar1 != '\0') goto LAB_00140625;
    pcVar7 = "Failed to parse input.";
LAB_00140701:
    poVar5 = std::operator<<((ostream *)&std::cerr,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  bVar6 = false;
LAB_00140717:
  google::protobuf::io::FileOutputStream::~FileOutputStream(&out);
  google::protobuf::io::FileInputStream::~FileInputStream(&in);
  if (message.ptr_ != (Message *)0x0) {
    (**(code **)(*(long *)message.ptr_ + 8))();
  }
  google::protobuf::DynamicMessageFactory::~DynamicMessageFactory(&dynamic_factory);
  return bVar6;
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == NULL) {
    cerr << "Type not defined: " << codec_type_ << endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  scoped_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    cerr << "warning:  Input message is missing required fields:  "
         << message->InitializationErrorString() << endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    if (!message->SerializePartialToZeroCopyStream(&out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  }

  return true;
}